

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

int Gia_RsbRemovalCost(Gia_RsbMan_t *p,int Index)

{
  byte bVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint i;
  uint i_00;
  
  bVar1 = (byte)p->vObjs->nSize & 0x1f;
  uVar8 = 1 << bVar1;
  if (p->vSets[0]->nSize != uVar8) {
    __assert_fail("Vec_WecSize(p->vSets[0]) == (1 << Vec_IntSize(p->vObjs))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x5f5,"int Gia_RsbRemovalCost(Gia_RsbMan_t *, int)");
  }
  if (p->vSets[1]->nSize == uVar8) {
    uVar6 = 1 << ((byte)Index & 0x1f);
    iVar7 = 0;
    if (1 << bVar1 < 1) {
      uVar8 = 0;
    }
    for (i = 0; uVar8 != i; i = i + 1) {
      if ((i & uVar6) == 0) {
        i_00 = i ^ uVar6;
        pVVar2 = Vec_WecEntry(p->vSets[0],i);
        pVVar3 = Vec_WecEntry(p->vSets[1],i);
        pVVar4 = Vec_WecEntry(p->vSets[0],i_00);
        pVVar5 = Vec_WecEntry(p->vSets[1],i_00);
        iVar7 = iVar7 + (pVVar5->nSize + pVVar3->nSize) * (pVVar4->nSize + pVVar2->nSize);
      }
    }
    return iVar7;
  }
  __assert_fail("Vec_WecSize(p->vSets[1]) == (1 << Vec_IntSize(p->vObjs))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0x5f6,"int Gia_RsbRemovalCost(Gia_RsbMan_t *, int)");
}

Assistant:

int Gia_RsbRemovalCost( Gia_RsbMan_t * p, int Index )
{
    Vec_Int_t * vTemp[2][2];
    //unsigned Mask = Abc_InfoMask( Index );
    int m, m2, Cost = 0, nLeaves = 1 << Vec_IntSize(p->vObjs);
    assert( Vec_WecSize(p->vSets[0]) == (1 << Vec_IntSize(p->vObjs)) );
    assert( Vec_WecSize(p->vSets[1]) == (1 << Vec_IntSize(p->vObjs)) );
    for ( m = 0; m < nLeaves; m++ )
    {
        if ( m & (1 << Index) )
            continue;
        m2 = m ^ (1 << Index);
        vTemp[0][0] = Vec_WecEntry(p->vSets[0], m);
        vTemp[0][1] = Vec_WecEntry(p->vSets[1], m);
        vTemp[1][0] = Vec_WecEntry(p->vSets[0], m2);
        vTemp[1][1] = Vec_WecEntry(p->vSets[1], m2);
        Cost += (Vec_IntSize(vTemp[0][0]) + Vec_IntSize(vTemp[1][0])) * (Vec_IntSize(vTemp[0][1]) + Vec_IntSize(vTemp[1][1]));
    }
    return Cost;
}